

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,string *s)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *local_78;
  long local_70;
  long local_68 [2];
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_58;
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159748;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,local_78,local_70 + (long)local_78);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_58,(ComparisonBase *)local_40);
  _Var3._M_pi = local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar2 = local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159a00;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159a00;
    if (local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const std::string& s) { *this = Eq(s); }